

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O3

void TTD::NSSnapType::ParseSnapHandler
               (SnapHandler *snapHandler,bool readSeparator,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  TTD_PTR_ID TVar3;
  SnapHandlerPropertyEntry *pSVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000031,readSeparator));
  TVar3 = FileReader::ReadAddr(reader,handlerId,false);
  snapHandler->HandlerId = TVar3;
  uVar1 = FileReader::ReadUInt32(reader,extensibleFlag,true);
  snapHandler->IsExtensibleFlag = (byte)uVar1;
  uVar1 = FileReader::ReadUInt32(reader,inlineSlotCapacity,true);
  snapHandler->InlineSlotCapacity = uVar1;
  uVar1 = FileReader::ReadUInt32(reader,totalSlotCapacity,true);
  snapHandler->TotalSlotCapacity = uVar1;
  uVar1 = FileReader::ReadLengthValue(reader,true);
  snapHandler->MaxPropertyIndex = uVar1;
  if (uVar1 == 0) {
    snapHandler->PropertyInfoArray = (SnapHandlerPropertyEntry *)0x0;
  }
  else {
    pSVar4 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapType::SnapHandlerPropertyEntry>
                       (alloc,(ulong)uVar1);
    snapHandler->PropertyInfoArray = pSVar4;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (snapHandler->MaxPropertyIndex != 0) {
      uVar5 = 0;
      do {
        (*reader->_vptr_FileReader[6])(reader,(ulong)(uVar5 != 0));
        uVar1 = FileReader::ReadUInt32(reader,propertyId,false);
        snapHandler->PropertyInfoArray[uVar5].PropertyRecordId = uVar1;
        (*reader->_vptr_FileReader[3])(reader,0x1c,1);
        iVar2 = (*reader->_vptr_FileReader[0x12])(reader,0);
        snapHandler->PropertyInfoArray[uVar5].DataKind = (SnapEntryDataKindTag)iVar2;
        (*reader->_vptr_FileReader[3])(reader,0x1d,1);
        iVar2 = (*reader->_vptr_FileReader[0x12])(reader,0);
        snapHandler->PropertyInfoArray[uVar5].AttributeInfo = (SnapAttributeTag)iVar2;
        (*reader->_vptr_FileReader[7])(reader);
        uVar5 = uVar5 + 1;
      } while (uVar5 < snapHandler->MaxPropertyIndex);
    }
    (*reader->_vptr_FileReader[5])(reader);
  }
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void ParseSnapHandler(SnapHandler* snapHandler, bool readSeparator, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);

            snapHandler->HandlerId = reader->ReadAddr(NSTokens::Key::handlerId);

            snapHandler->IsExtensibleFlag = (byte)reader->ReadUInt32(NSTokens::Key::extensibleFlag, true);

            snapHandler->InlineSlotCapacity = reader->ReadUInt32(NSTokens::Key::inlineSlotCapacity, true);
            snapHandler->TotalSlotCapacity = reader->ReadUInt32(NSTokens::Key::totalSlotCapacity, true);

            snapHandler->MaxPropertyIndex = reader->ReadLengthValue(true);

            if(snapHandler->MaxPropertyIndex == 0)
            {
                snapHandler->PropertyInfoArray = nullptr;
            }
            else
            {
                snapHandler->PropertyInfoArray = alloc.SlabAllocateArray<SnapHandlerPropertyEntry>(snapHandler->MaxPropertyIndex);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < snapHandler->MaxPropertyIndex; ++i)
                {
                    reader->ReadRecordStart(i != 0);

                    snapHandler->PropertyInfoArray[i].PropertyRecordId = reader->ReadUInt32(NSTokens::Key::propertyId);
                    snapHandler->PropertyInfoArray[i].DataKind = reader->ReadTag<SnapEntryDataKindTag>(NSTokens::Key::dataKindTag, true);
                    snapHandler->PropertyInfoArray[i].AttributeInfo = reader->ReadTag<SnapAttributeTag>(NSTokens::Key::attributeTag, true);

                    reader->ReadRecordEnd();
                }
                reader->ReadSequenceEnd();
            }

            reader->ReadRecordEnd();
        }